

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwindowsysteminterface.cpp
# Opt level: O2

bool QWindowSystemInterface::handleMouseEvent<QWindowSystemInterface::SynchronousDelivery>
               (QWindow *window,ulong timestamp,QPointingDevice *device,QPointF *local,
               QPointF *global,MouseButtons state,MouseButton button,Type type,
               KeyboardModifiers mods,MouseEventSource source)

{
  bool bVar1;
  QPointF args_2;
  QPointF args_3;
  
  if (type - NonClientAreaMouseMove < 3) {
    bVar1 = true;
  }
  else {
    bVar1 = false;
    if ((1 < type - MouseButtonPress) &&
       ((type == MouseButtonDblClick || (bVar1 = false, type != MouseMove)))) {
      return false;
    }
  }
  args_2 = QHighDpi::fromNativeLocalPosition<QPointF,QWindow>(local,window);
  args_3 = QHighDpi::fromNativeGlobalPosition<QPointF,QWindow>(global,window);
  bVar1 = QWindowSystemHelper<QWindowSystemInterface::SynchronousDelivery>::
          handleEvent<QWindowSystemInterfacePrivate::MouseEvent,QWindow*,unsigned_long,QPointF,QPointF,QFlags<Qt::MouseButton>,QFlags<Qt::KeyboardModifier>,Qt::MouseButton,QEvent::Type,Qt::MouseEventSource,bool,QPointingDevice_const*>
                    (window,timestamp,args_2,args_3,
                     (QFlags<Qt::MouseButton>)
                     state.super_QFlagsStorageHelper<Qt::MouseButton,_4>.
                     super_QFlagsStorage<Qt::MouseButton>.i,
                     (QFlags<Qt::KeyboardModifier>)
                     mods.super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
                     super_QFlagsStorage<Qt::KeyboardModifier>.i,button,type,source,bVar1,device);
  return bVar1;
}

Assistant:

QT_DEFINE_QPA_EVENT_HANDLER(bool, handleMouseEvent, QWindow *window, ulong timestamp, const QPointingDevice *device,
                            const QPointF &local, const QPointF &global, Qt::MouseButtons state,
                            Qt::MouseButton button, QEvent::Type type, Qt::KeyboardModifiers mods,
                            Qt::MouseEventSource source)
{

    bool isNonClientArea = {};

    switch (type) {
    case QEvent::MouseButtonDblClick:
    case QEvent::NonClientAreaMouseButtonDblClick:
        Q_ASSERT_X(false, "QWindowSystemInterface::handleMouseEvent",
               "QTBUG-71263: Native double clicks are not implemented.");
        return false;
    case QEvent::MouseMove:
    case QEvent::MouseButtonPress:
    case QEvent::MouseButtonRelease:
        isNonClientArea = false;
        break;
    case QEvent::NonClientAreaMouseMove:
    case QEvent::NonClientAreaMouseButtonPress:
    case QEvent::NonClientAreaMouseButtonRelease:
        isNonClientArea = true;
        break;
    default:
        Q_UNREACHABLE();
    }

    auto localPos = QHighDpi::fromNativeLocalPosition(local, window);
    auto globalPos = QHighDpi::fromNativeGlobalPosition(global, window);

    return handleWindowSystemEvent<QWindowSystemInterfacePrivate::MouseEvent, Delivery>(window,
        timestamp, localPos, globalPos, state, mods, button, type, source, isNonClientArea, device);
}